

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

IWindowPtr __thiscall cursespp::LayoutBase::GetFocus(LayoutBase *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  long *plVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  element_type *peVar4;
  IWindowPtr IVar5;
  value_type view;
  __shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  iVar2 = *(int *)(in_RSI + 0x1f8);
  if ((-1 < (long)iVar2) &&
     (iVar2 < (int)((ulong)(*(long *)(in_RSI + 0x1e8) - *(long *)(in_RSI + 0x1e0)) >> 4))) {
    std::__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,
               (__shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(in_RSI + 0x1e0) + (long)iVar2 * 0x10));
    iVar2 = (*((local_20._M_ptr)->super_IOrderable)._vptr_IOrderable[0x23])();
    peVar4 = local_20._M_ptr;
    if ((char)iVar2 != '\0') {
      if (local_20._M_ptr == (element_type *)0x0) {
        peVar4 = (element_type *)0x0;
LAB_0018794a:
        _Var1._M_pi = local_20._M_refcount._M_pi;
        (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable = (_func_int **)peVar4;
        local_20._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
             (_func_int **)_Var1._M_pi;
        local_20._M_ptr = (element_type *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(local_20._M_ptr,&IWindow::typeinfo,&typeinfo,0);
        if (plVar3 == (long *)0x0) goto LAB_0018794a;
        (**(code **)(*plVar3 + 0x1d0))(this,plVar3);
        if ((this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable ==
            (_func_int **)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(this->super_Window).super_IWindow.super_IDisplayable);
          peVar4 = local_20._M_ptr;
          goto LAB_0018794a;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
      in_RDX._M_pi = extraout_RDX_00;
      goto LAB_0018793c;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    in_RDX._M_pi = extraout_RDX;
  }
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable = (_func_int **)0x0;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable = (_func_int **)0x0;
LAB_0018793c:
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::GetFocus() {
    if (this->focused >= 0 && (int) this->focusable.size() > this->focused) {
        auto view = this->focusable[this->focused];
        if (view->IsVisible()) {
            /* see if the currently focused view is a layout. if it is, see if it
            has something focused. if it does, return that. if it doesn't, just
            return the view itself. this is confusing, but allows nested circular
            layouts to function automatically */
            LayoutBase* asLayoutBase = dynamic_cast<LayoutBase*>(view.get());
            if (asLayoutBase) {
                auto focused = asLayoutBase->GetFocus();
                if (focused) {
                    return focused;
                }
            }
            return view;
        }
    }

    return IWindowPtr();
}